

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

size_t __thiscall google::protobuf::UninterpretedOption::ByteSizeLong(UninterpretedOption *this)

{
  uint uVar1;
  void *pvVar2;
  size_type sVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  Type *this_00;
  size_t sVar7;
  ulong uVar8;
  uint uVar9;
  size_t sVar10;
  
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) == 0) {
    sVar10 = 0;
  }
  else {
    sVar10 = internal::WireFormat::ComputeUnknownFieldsSize
                       ((UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  uVar1 = (this->name_).super_RepeatedPtrFieldBase.current_size_;
  sVar10 = sVar10 + uVar1;
  if ((ulong)uVar1 != 0) {
    uVar9 = 0;
    do {
      this_00 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::TypeHandler>
                          (&(this->name_).super_RepeatedPtrFieldBase,uVar9);
      sVar7 = UninterpretedOption_NamePart::ByteSizeLong(this_00);
      uVar6 = (uint)sVar7 | 1;
      iVar4 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar10 = sVar10 + sVar7 + (ulong)(iVar4 * 9 + 0x49U >> 6);
      uVar9 = uVar9 + 1;
    } while (uVar1 != uVar9);
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 0x3f) != 0) {
    if ((uVar1 & 1) != 0) {
      sVar3 = ((this->identifier_value_).ptr_)->_M_string_length;
      uVar9 = (uint)sVar3 | 1;
      iVar4 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar10 = sVar10 + sVar3 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar1 & 2) != 0) {
      sVar3 = ((this->string_value_).ptr_)->_M_string_length;
      uVar9 = (uint)sVar3 | 1;
      iVar4 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar10 = sVar10 + sVar3 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar1 & 4) != 0) {
      sVar3 = ((this->aggregate_value_).ptr_)->_M_string_length;
      uVar9 = (uint)sVar3 | 1;
      iVar4 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar10 = sVar10 + sVar3 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar1 & 8) != 0) {
      uVar8 = this->positive_int_value_ | 1;
      lVar5 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      sVar10 = sVar10 + ((int)lVar5 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar1 & 0x10) != 0) {
      uVar8 = this->negative_int_value_ | 1;
      lVar5 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      sVar10 = sVar10 + ((int)lVar5 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar1 & 0x20) != 0) {
      sVar10 = sVar10 + 9;
    }
  }
  this->_cached_size_ = (int)sVar10;
  return sVar10;
}

Assistant:

size_t UninterpretedOption::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.UninterpretedOption)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated .google.protobuf.UninterpretedOption.NamePart name = 2;
  {
    unsigned int count = this->name_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->name(i));
    }
  }

  if (_has_bits_[0 / 32] & 63u) {
    // optional string identifier_value = 3;
    if (has_identifier_value()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->identifier_value());
    }

    // optional bytes string_value = 7;
    if (has_string_value()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::BytesSize(
          this->string_value());
    }

    // optional string aggregate_value = 8;
    if (has_aggregate_value()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->aggregate_value());
    }

    // optional uint64 positive_int_value = 4;
    if (has_positive_int_value()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt64Size(
          this->positive_int_value());
    }

    // optional int64 negative_int_value = 5;
    if (has_negative_int_value()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int64Size(
          this->negative_int_value());
    }

    // optional double double_value = 6;
    if (has_double_value()) {
      total_size += 1 + 8;
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}